

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

int64_t CLI::detail::to_flag_value(string *val)

{
  char cVar1;
  __type_conflict _Var2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  int *piVar9;
  char *pcVar10;
  longlong lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *loc_ptr;
  int64_t ret;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff79;
  undefined1 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7b;
  undefined4 in_stack_ffffffffffffff7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff98;
  char *pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined1 local_12 [10];
  long local_8;
  
  if ((to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_),
     iVar6 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,(allocator<char> *)in_RDI
              );
    ::std::allocator<char>::~allocator((allocator<char> *)(local_12 + 1));
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  }
  if ((to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_),
     iVar6 != 0)) {
    in_stack_ffffffffffffff80 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_12;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,(allocator<char> *)in_RDI
              );
    ::std::allocator<char>::~allocator((allocator<char> *)local_12);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
  }
  _Var2 = ::std::operator==(in_stack_ffffffffffffff80,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff7c,
                                     CONCAT13(in_stack_ffffffffffffff7b,
                                              CONCAT12(in_stack_ffffffffffffff7a,
                                                       CONCAT11(in_stack_ffffffffffffff79,
                                                                in_stack_ffffffffffffff78)))));
  if (_Var2) {
    local_8 = 1;
  }
  else {
    _Var2 = ::std::operator==(in_stack_ffffffffffffff80,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff7c,
                                       CONCAT13(in_stack_ffffffffffffff7b,
                                                CONCAT12(in_stack_ffffffffffffff7a,
                                                         CONCAT11(in_stack_ffffffffffffff79,
                                                                  in_stack_ffffffffffffff78)))));
    if (_Var2) {
      local_8 = -1;
    }
    else {
      ::std::__cxx11::string::string
                (in_stack_ffffffffffffffa0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff98);
      to_lower(in_stack_ffffffffffffff98);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      ::std::__cxx11::string::~string(in_stack_ffffffffffffff60);
      ::std::__cxx11::string::~string(in_stack_ffffffffffffff60);
      sVar7 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(in_RDI);
      if (sVar7 == 1) {
        pvVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
        if ((*pvVar8 < '1') ||
           (pvVar8 = ::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58),
           '9' < *pvVar8)) {
          pvVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
          cVar1 = *pvVar8;
          if (cVar1 != '+') {
            if ((((cVar1 == '-') || (cVar1 == '0')) || (cVar1 == 'f')) || (cVar1 == 'n')) {
              return -1;
            }
            if ((cVar1 != 't') && (cVar1 != 'y')) {
              piVar9 = __errno_location();
              *piVar9 = 0x16;
              return -1;
            }
          }
          local_8 = 1;
        }
        else {
          pvVar8 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
          local_8 = (long)*pvVar8 + -0x30;
        }
      }
      else {
        _Var2 = ::std::operator==(in_stack_ffffffffffffff80,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_ffffffffffffff7c,
                                              CONCAT13(in_stack_ffffffffffffff7b,
                                                       CONCAT12(in_stack_ffffffffffffff7a,
                                                                CONCAT11(in_stack_ffffffffffffff79,
                                                                         in_stack_ffffffffffffff78))
                                                      )));
        if ((((_Var2) ||
             (uVar3 = ::std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58),
             (bool)uVar3)) ||
            (uVar4 = ::std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58),
            (bool)uVar4)) ||
           (bVar5 = ::std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58), bVar5))
        {
          local_8 = 1;
        }
        else {
          _Var2 = ::std::operator==(in_stack_ffffffffffffff80,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffff7c,
                                                CONCAT13(uVar3,CONCAT12(uVar4,CONCAT11(bVar5,
                                                  in_stack_ffffffffffffff78)))));
          if (((_Var2) ||
              (bVar5 = ::std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58), bVar5
              )) || ((bVar5 = ::std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
                     , bVar5 ||
                     (bVar5 = ::std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58)
                     , bVar5)))) {
            local_8 = -1;
          }
          else {
            pcVar12 = (char *)0x0;
            pcVar10 = ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                (in_stack_ffffffffffffff60);
            lVar11 = strtoll(pcVar10,(char **)&stack0xffffffffffffff98,0);
            pcVar10 = ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                                (in_stack_ffffffffffffff60);
            sVar7 = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI);
            local_8 = lVar11;
            if ((pcVar12 != pcVar10 + sVar7) &&
               (piVar9 = __errno_location(), local_8 = lVar11, *piVar9 == 0)) {
              piVar9 = __errno_location();
              *piVar9 = 0x16;
              local_8 = lVar11;
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

inline std::int64_t to_flag_value(std::string val) noexcept {
    static const std::string trueString("true");
    static const std::string falseString("false");
    if(val == trueString) {
        return 1;
    }
    if(val == falseString) {
        return -1;
    }
    val = detail::to_lower(val);
    std::int64_t ret = 0;
    if(val.size() == 1) {
        if(val[0] >= '1' && val[0] <= '9') {
            return (static_cast<std::int64_t>(val[0]) - '0');
        }
        switch(val[0]) {
        case '0':
        case 'f':
        case 'n':
        case '-':
            ret = -1;
            break;
        case 't':
        case 'y':
        case '+':
            ret = 1;
            break;
        default:
            errno = EINVAL;
            return -1;
        }
        return ret;
    }
    if(val == trueString || val == "on" || val == "yes" || val == "enable") {
        ret = 1;
    } else if(val == falseString || val == "off" || val == "no" || val == "disable") {
        ret = -1;
    } else {
        char *loc_ptr{nullptr};
        ret = std::strtoll(val.c_str(), &loc_ptr, 0);
        if(loc_ptr != (val.c_str() + val.size()) && errno == 0) {
            errno = EINVAL;
        }
    }
    return ret;
}